

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::expression_read_implies_multiple_reads(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRExpression *pSVar4;
  
  uVar3 = (ulong)id;
  if (uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) {
    pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
    if (pVVar1[uVar3].type == TypeExpression) {
      pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar3);
      bVar2 = pSVar4->emitted_loop_level < (this->super_Compiler).current_loop_level;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

const T *maybe_get(uint32_t id) const
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}